

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

string * __thiscall
gnuplotio::Gnuplot::binfmt<std::vector<unsigned_int,std::allocator<unsigned_int>>,gnuplotio::Mode1D>
          (string *__return_storage_ptr__,undefined8 param_2,undefined4 *arg,char *arr_or_rec)

{
  int iVar1;
  ostream *poVar2;
  ostringstream tmp;
  long *local_1f8 [2];
  long local_1e8 [6];
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined1 local_1a0 [376];
  
  iVar1 = std::__cxx11::string::compare(arr_or_rec);
  if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare(arr_or_rec), iVar1 != 0)) {
    __assert_fail("(arr_or_rec == \"array\") || (arr_or_rec == \"record\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/dstahlke[P]gnuplot-iostream/gnuplot-iostream.h"
                  ,0x706,
                  "std::string gnuplotio::Gnuplot::binfmt(const T &, const std::string &, OrganizationMode) [T = std::vector<unsigned int>, OrganizationMode = gnuplotio::Mode1D]"
                 );
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," format=\'",9);
  local_1b8 = *arg;
  uStack_1b4 = arg[1];
  uStack_1b0 = arg[2];
  uStack_1ac = arg[3];
  print_block<1ul,gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>,gnuplotio::ModeBinfmt>
            (local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\' ",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,*(char **)arr_or_rec,*(long *)(arr_or_rec + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=(",2);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," ",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1f8);
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string binfmt(const T &arg, const std::string &arr_or_rec, OrganizationMode) {
        assert((arr_or_rec == "array") || (arr_or_rec == "record"));
        std::string ret;
        try {
            std::ostringstream tmp;
            tmp << " format='";
            top_level_array_sender(tmp, arg, OrganizationMode(), ModeBinfmt());
            tmp << "' " << arr_or_rec << "=(";
            top_level_array_sender(tmp, arg, OrganizationMode(), ModeSize());
            tmp << ")";
            tmp << " ";
            ret = tmp.str();
        } catch(const plotting_empty_container &) {
            ret = std::string(" format='' ") + arr_or_rec + "=(0) ";
        }
        return ret;
    }